

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_atomic_test.c
# Opt level: O1

char * test_recorded_values(void)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  _Bool _Var4;
  char *unaff_RBX;
  int iVar5;
  long lVar6;
  hdr_iter iter;
  hdr_iter local_b0;
  
  load_histograms();
  hdr_iter_recorded_init(&local_b0,raw_histogram);
  iVar5 = 0;
  do {
    _Var4 = hdr_iter_next(&local_b0);
    if (!_Var4) {
      if (iVar5 != 2) {
        return "Should have encountered 2 values";
      }
      hdr_iter_recorded_init(&local_b0,cor_histogram);
      lVar6 = 0;
      iVar5 = 0;
      do {
        _Var4 = hdr_iter_next(&local_b0);
        if (!_Var4) {
          if (lVar6 == 20000) {
            return (char *)0x0;
          }
          return "Total counts should be 20000";
        }
        bVar1 = false;
        if (local_b0.specifics.linear.value_units_per_bucket == 10000 || iVar5 != 0) {
          if (local_b0.count == 0) {
            bVar1 = false;
            unaff_RBX = "Count should not be 0";
          }
          else if (local_b0.count == local_b0.specifics.linear.value_units_per_bucket) {
            lVar6 = lVar6 + local_b0.specifics.linear.value_units_per_bucket;
            iVar5 = iVar5 + 1;
            bVar1 = true;
          }
          else {
            bVar1 = false;
            unaff_RBX = "Count at value iterated to should be count added in this step";
          }
        }
        else {
          iVar5 = 0;
          unaff_RBX = "Count at 0 is not 10000";
        }
      } while (bVar1);
      return unaff_RBX;
    }
    if (iVar5 == 0) {
      bVar1 = false;
      pcVar2 = "Value at 0 is not 10000";
      iVar3 = 0;
      if (local_b0.specifics.linear.value_units_per_bucket == 10000) goto LAB_00101b5b;
    }
    else if (local_b0.specifics.linear.value_units_per_bucket == 1) {
LAB_00101b5b:
      bVar1 = true;
      pcVar2 = unaff_RBX;
      iVar3 = iVar5 + 1;
    }
    else {
      bVar1 = false;
      pcVar2 = "Value at 1 is not 1";
      iVar3 = iVar5;
    }
    iVar5 = iVar3;
    unaff_RBX = pcVar2;
    if (!bVar1) {
      return unaff_RBX;
    }
  } while( true );
}

Assistant:

static char* test_recorded_values(void)
{
    struct hdr_iter iter;
    int index;
    int64_t total_added_count = 0;

    load_histograms();

    /* Raw Histogram */
    hdr_iter_recorded_init(&iter, raw_histogram);

    index = 0;
    while (hdr_iter_next(&iter))
    {
        int64_t count_added_in_this_bucket = iter.specifics.recorded.count_added_in_this_iteration_step;
        if (index == 0)
        {
            mu_assert("Value at 0 is not 10000", count_added_in_this_bucket == 10000);
        }
        else
        {
            mu_assert("Value at 1 is not 1", count_added_in_this_bucket == 1);
        }

        index++;
    }
    mu_assert("Should have encountered 2 values", index == 2);

    /* Corrected Histogram */
    hdr_iter_recorded_init(&iter, cor_histogram);

    index = 0;
    while (hdr_iter_next(&iter))
    {
        int64_t count_added_in_this_bucket = iter.specifics.recorded.count_added_in_this_iteration_step;
        if (index == 0)
        {
            mu_assert("Count at 0 is not 10000", count_added_in_this_bucket == 10000);
        }
        mu_assert("Count should not be 0", iter.count != 0);
        mu_assert("Count at value iterated to should be count added in this step",
                  iter.count == count_added_in_this_bucket);
        total_added_count += count_added_in_this_bucket;
        index++;
    }
    mu_assert("Total counts should be 20000", total_added_count == 20000);

    return 0;
}